

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_typeof(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *obj1;
  SQRESULT SVar2;
  SQObjectPtr res;
  SQObjectPtr local_20;
  
  if (idx < 0) {
    obj1 = SQVM::GetUp(v,idx);
  }
  else {
    obj1 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  local_20.super_SQObject._type = OT_NULL;
  local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = SQVM::TypeOf(v,obj1,&local_20);
  SVar2 = -1;
  if (bVar1) {
    SQVM::Push(v,&local_20);
    SVar2 = 0;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return SVar2;
}

Assistant:

SQRESULT sq_typeof(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectPtr res;
    if(!v->TypeOf(o,res)) {
        return SQ_ERROR;
    }
    v->Push(res);
    return SQ_OK;
}